

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::elasticityFilter
          (Highs *this,double global_lower_penalty,double global_upper_penalty,
          double global_rhs_penalty,double *param_4,double *param_5,double *param_6,
          bool get_infeasible_row,vector<int,_std::allocator<int>_> *infeasible_row_subset)

{
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *__x_00;
  double *pdVar1;
  double dVar2;
  int original_num_col;
  int iVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer piVar6;
  vector<double,_std::allocator<double>_> original_col_upper_00;
  vector<double,_std::allocator<double>_> original_col_upper_01;
  vector<double,_std::allocator<double>_> original_col_upper_02;
  vector<double,_std::allocator<double>_> original_col_upper_03;
  vector<HighsVarType,_std::allocator<HighsVarType>_> original_integrality_00;
  vector<HighsVarType,_std::allocator<HighsVarType>_> original_integrality_01;
  vector<HighsVarType,_std::allocator<HighsVarType>_> original_integrality_02;
  vector<HighsVarType,_std::allocator<HighsVarType>_> original_integrality_03;
  HighsStatus return_status;
  long lVar7;
  byte bVar8;
  HighsInt HVar9;
  int iVar10;
  uint uVar11;
  size_t eCol;
  undefined7 in_register_00000081;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  _Vector_base<double,_std::allocator<double>_> *this_00;
  size_t eCol_3;
  ulong uVar15;
  size_type __n;
  _Vector_base<HighsVarType,_std::allocator<HighsVarType>_> *this_01;
  byte bVar16;
  pointer pdVar17;
  int local_4b8;
  undefined2 uStack_4b4;
  byte local_4b2;
  byte local_4b1;
  HighsStatus run_status;
  undefined4 uStack_4ac;
  int local_4a8;
  HighsInt evar_ix;
  pointer local_4a0;
  anon_class_16_2_1ead1ca1 solveLp;
  double upper;
  vector<double,_std::allocator<double>_> col_upper;
  double upper_penalty;
  undefined4 local_43c;
  vector<double,_std::allocator<double>_> col_lower;
  double lower_penalty;
  double lower;
  pointer pdStack_3f0;
  pointer local_3e8;
  vector<double,_std::allocator<double>_> ecol_cost;
  vector<int,_std::allocator<int>_> col_of_ecol;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  HighsInt iRow;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ecol_name;
  vector<int,_std::allocator<int>_> erow_index;
  vector<int,_std::allocator<int>_> row_of_ecol;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  vector<int,_std::allocator<int>_> erow_start;
  vector<double,_std::allocator<double>_> ecol_upper;
  vector<double,_std::allocator<double>_> ecol_lower;
  vector<double,_std::allocator<double>_> erow_value;
  vector<double,_std::allocator<double>_> bound_of_col_of_ecol;
  vector<HighsVarType,_std::allocator<HighsVarType>_> original_integrality;
  vector<double,_std::allocator<double>_> original_col_upper;
  vector<double,_std::allocator<double>_> original_col_lower;
  vector<double,_std::allocator<double>_> original_col_cost;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  erow_name;
  vector<double,_std::allocator<double>_> erow_upper;
  vector<double,_std::allocator<double>_> erow_lower;
  vector<double,_std::allocator<double>_> bound_of_row_of_ecol;
  vector<double,_std::allocator<double>_> zero_costs;
  _Vector_base<HighsVarType,_std::allocator<HighsVarType>_> local_f0;
  _Vector_base<double,_std::allocator<double>_> local_d8;
  _Vector_base<HighsVarType,_std::allocator<HighsVarType>_> local_c0;
  _Vector_base<double,_std::allocator<double>_> local_a8;
  _Vector_base<HighsVarType,_std::allocator<HighsVarType>_> local_90;
  _Vector_base<double,_std::allocator<double>_> local_78;
  _Vector_base<HighsVarType,_std::allocator<HighsVarType>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_43c = (undefined4)CONCAT71(in_register_00000081,get_infeasible_row);
  col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ecol_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ecol_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ecol_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  erow_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  erow_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  erow_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  original_num_col = (this->model_).lp_.num_col_;
  local_4a8 = (this->model_).lp_.num_row_;
  evar_ix = original_num_col;
  std::vector<double,_std::allocator<double>_>::vector
            (&original_col_cost,&(this->model_).lp_.col_cost_);
  __x = &(this->model_).lp_.col_lower_;
  std::vector<double,_std::allocator<double>_>::vector(&original_col_lower,__x);
  __x_00 = &(this->model_).lp_.col_upper_;
  std::vector<double,_std::allocator<double>_>::vector(&original_col_upper,__x_00);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
            (&original_integrality,&(this->model_).lp_.integrality_);
  zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  solveLp.this = (Highs *)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&zero_costs,(long)original_num_col,(value_type_conflict1 *)&solveLp);
  run_status = changeColsCost(this,0,(this->model_).lp_.num_col_ + -1,
                              zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start);
  if (((char)local_43c != '\0') &&
     ((this->model_).lp_.integrality_.
      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->model_).lp_.integrality_.
      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    solveLp.this = (Highs *)0x0;
    solveLp.run_status = (HighsStatus *)0x0;
    iRow = iRow & 0xffffff00;
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::_M_fill_assign
              ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)&solveLp,
               (long)original_num_col,(value_type *)&iRow);
    run_status = changeColsIntegrality
                           (this,0,(this->model_).lp_.num_col_ + -1,(HighsVarType *)solveLp.this);
    std::_Vector_base<HighsVarType,_std::allocator<HighsVarType>_>::~_Vector_base
              ((_Vector_base<HighsVarType,_std::allocator<HighsVarType>_> *)&solveLp);
  }
  bVar16 = -(0.0 <= global_lower_penalty) | -(0.0 <= global_upper_penalty);
  local_4b1 = (param_5 != (double *)0x0 || param_4 != (double *)0x0) | bVar16;
  local_4b2 = 0.0 <= global_rhs_penalty;
  iVar3 = (this->model_).lp_.num_col_;
  local_4a0 = (pointer)CONCAT44(local_4a0._4_4_,iVar3);
  bVar8 = param_6 != (double *)0x0;
  if ((param_5 != (double *)0x0 || param_4 != (double *)0x0) || (bVar16 & 1) != 0) {
    uStack_4ac = CONCAT13(param_6 != (double *)0x0,(undefined3)uStack_4ac);
    col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_4a0 = (this->model_).lp_.col_names_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (this->model_).lp_.col_names_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    solveLp.this = (Highs *)((ulong)solveLp.this & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&erow_start,(int *)&solveLp);
    local_4b8 = 0;
    while( true ) {
      iVar10 = (this->model_).lp_.num_col_;
      if (iVar10 <= local_4b8) break;
      lower = (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[local_4b8];
      upper = (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[local_4b8];
      std::vector<double,_std::allocator<double>_>::push_back(&col_lower,&lower);
      std::vector<double,_std::allocator<double>_>::push_back(&col_upper,&upper);
      if ((-INFINITY < lower) || (upper < INFINITY)) {
        lower_penalty = global_lower_penalty;
        if (param_4 != (double *)0x0) {
          lower_penalty = param_4[local_4b8];
        }
        if ((0.0 <= lower_penalty) || (upper < INFINITY)) {
          upper_penalty = global_upper_penalty;
          if (param_5 != (double *)0x0) {
            upper_penalty = param_5[local_4b8];
          }
          if ((-INFINITY < lower) || (0.0 <= upper_penalty)) {
            std::vector<double,_std::allocator<double>_>::push_back(&erow_lower,&lower);
            std::vector<double,_std::allocator<double>_>::push_back(&erow_upper,&upper);
            if (pbVar4 != local_4a0) {
              std::__cxx11::to_string(&local_398,local_4b8);
              std::operator+(&local_2b8,"row_",&local_398);
              std::operator+(&local_378,&local_2b8,"_");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &iRow,&local_378,
                             (this->model_).lp_.col_names_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + local_4b8);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &solveLp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&iRow,"_erow");
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &erow_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &solveLp);
              std::__cxx11::string::~string((string *)&solveLp);
              std::__cxx11::string::~string((string *)&iRow);
              std::__cxx11::string::~string((string *)&local_378);
              std::__cxx11::string::~string((string *)&local_2b8);
              std::__cxx11::string::~string((string *)&local_398);
            }
            std::vector<int,_std::allocator<int>_>::push_back(&erow_index,&local_4b8);
            solveLp.this = (Highs *)0x3ff0000000000000;
            std::vector<double,_std::allocator<double>_>::emplace_back<double>
                      (&erow_value,(double *)&solveLp);
            if ((lower != -INFINITY) && (0.0 <= lower_penalty)) {
              std::vector<int,_std::allocator<int>_>::push_back(&col_of_ecol,&local_4b8);
              if (pbVar4 != local_4a0) {
                std::__cxx11::to_string(&local_398,local_4b8);
                std::operator+(&local_2b8,"col_",&local_398);
                std::operator+(&local_378,&local_2b8,"_");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &iRow,&local_378,
                               (this->model_).lp_.col_names_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + local_4b8);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &solveLp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&iRow,"_lower");
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &ecol_name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &solveLp);
                std::__cxx11::string::~string((string *)&solveLp);
                std::__cxx11::string::~string((string *)&iRow);
                std::__cxx11::string::~string((string *)&local_378);
                std::__cxx11::string::~string((string *)&local_2b8);
                std::__cxx11::string::~string((string *)&local_398);
              }
              std::vector<double,_std::allocator<double>_>::push_back(&bound_of_col_of_ecol,&lower);
              col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_4b8] = -INFINITY;
              std::vector<int,_std::allocator<int>_>::push_back(&erow_index,&evar_ix);
              solveLp.this = (Highs *)0x3ff0000000000000;
              std::vector<double,_std::allocator<double>_>::emplace_back<double>
                        (&erow_value,(double *)&solveLp);
              std::vector<double,_std::allocator<double>_>::push_back(&ecol_cost,&lower_penalty);
              evar_ix = evar_ix + 1;
            }
            if ((upper != INFINITY) && (0.0 <= upper_penalty)) {
              std::vector<int,_std::allocator<int>_>::push_back(&col_of_ecol,&local_4b8);
              if (pbVar4 != local_4a0) {
                std::__cxx11::to_string(&local_398,local_4b8);
                std::operator+(&local_2b8,"col_",&local_398);
                std::operator+(&local_378,&local_2b8,"_");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &iRow,&local_378,
                               (this->model_).lp_.col_names_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + local_4b8);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &solveLp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&iRow,"_upper");
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &ecol_name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &solveLp);
                std::__cxx11::string::~string((string *)&solveLp);
                std::__cxx11::string::~string((string *)&iRow);
                std::__cxx11::string::~string((string *)&local_378);
                std::__cxx11::string::~string((string *)&local_2b8);
                std::__cxx11::string::~string((string *)&local_398);
              }
              std::vector<double,_std::allocator<double>_>::push_back(&bound_of_col_of_ecol,&upper);
              col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_4b8] = INFINITY;
              std::vector<int,_std::allocator<int>_>::push_back(&erow_index,&evar_ix);
              solveLp.this = (Highs *)0xbff0000000000000;
              std::vector<double,_std::allocator<double>_>::emplace_back<double>
                        (&erow_value,(double *)&solveLp);
              std::vector<double,_std::allocator<double>_>::push_back(&ecol_cost,&upper_penalty);
              evar_ix = evar_ix + 1;
            }
            solveLp.this = (Highs *)CONCAT44(solveLp.this._4_4_,
                                             (int)((ulong)((long)erow_index.
                                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)erow_index.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2));
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(&erow_start,(int *)&solveLp);
          }
        }
      }
      local_4b8 = local_4b8 + 1;
    }
    uVar15 = (long)col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar14 = (int)((ulong)((long)erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2) - 1;
    HVar9 = erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[(int)uVar14];
    run_status = changeColsBounds(this,0,iVar10 + -1,
                                  col_lower.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  col_upper.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
    uVar15 = uVar15 >> 2;
    iVar10 = (int)uVar15;
    solveLp.this = (Highs *)0x0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&ecol_lower,(long)iVar10,(value_type_conflict1 *)&solveLp);
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&ecol_upper,(long)iVar10,(value_type_conflict1 *)&kHighsInf);
    run_status = addCols(this,iVar10,
                         ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,0,(HighsInt *)0x0,(HighsInt *)0x0,
                         (double *)0x0);
    run_status = addRows(this,uVar14,
                         erow_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         erow_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,HVar9,
                         erow_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         erow_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         erow_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start);
    if (pbVar4 != local_4a0) {
      uVar12 = 0;
      uVar15 = uVar15 & 0xffffffff;
      if (iVar10 < 1) {
        uVar15 = uVar12;
      }
      HVar9 = iVar3;
      for (; uVar15 * 0x20 != uVar12; uVar12 = uVar12 + 0x20) {
        passColName(this,HVar9,
                    (string *)
                    ((long)&((ecol_name.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar12
                    ));
        HVar9 = HVar9 + 1;
      }
      uVar12 = 0;
      uVar15 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar15 = uVar12;
      }
      iVar10 = local_4a8;
      for (; uVar15 * 0x20 != uVar12; uVar12 = uVar12 + 0x20) {
        passRowName(this,iVar10,
                    (string *)
                    ((long)&((erow_name.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar12
                    ));
        iVar10 = iVar10 + 1;
      }
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&col_upper.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&col_lower.super__Vector_base<double,_std::allocator<double>_>);
    local_4a0 = (pointer)CONCAT44(local_4a0._4_4_,(this->model_).lp_.num_col_);
    bVar8 = uStack_4ac._3_1_;
  }
  local_4b2 = local_4b2 | bVar8;
  if (local_4b2 != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&ecol_name);
    if (ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    lower = 0.0;
    pdStack_3f0 = (pointer)0x0;
    local_3e8 = (pointer)0x0;
    solveLp.this = (Highs *)((ulong)solveLp.this & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&col_lower,(int *)&solveLp);
    pbVar4 = (this->model_).lp_.row_names_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (this->model_).lp_.row_names_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (local_4b8 = 0; local_4b8 < local_4a8; local_4b8 = local_4b8 + 1) {
      upper = global_rhs_penalty;
      if (param_6 != (double *)0x0) {
        upper = param_6[local_4b8];
      }
      if (0.0 <= upper) {
        lower_penalty =
             (this->model_).lp_.row_lower_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[local_4b8];
        upper_penalty =
             (this->model_).lp_.row_upper_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[local_4b8];
        if (lower_penalty != -INFINITY) {
          std::vector<int,_std::allocator<int>_>::push_back(&row_of_ecol,&local_4b8);
          if (pbVar5 != pbVar4) {
            std::__cxx11::to_string(&local_398,local_4b8);
            std::operator+(&local_2b8,"row_",&local_398);
            std::operator+(&local_378,&local_2b8,"_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &iRow,&local_378,
                           (this->model_).lp_.row_names_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + local_4b8);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &solveLp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&iRow,"_lower");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &ecol_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&solveLp
                      );
            std::__cxx11::string::~string((string *)&solveLp);
            std::__cxx11::string::~string((string *)&iRow);
            std::__cxx11::string::~string((string *)&local_378);
            std::__cxx11::string::~string((string *)&local_2b8);
            std::__cxx11::string::~string((string *)&local_398);
          }
          std::vector<double,_std::allocator<double>_>::push_back
                    (&bound_of_row_of_ecol,&lower_penalty);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&col_upper,&local_4b8);
          solveLp.this = (Highs *)0x3ff0000000000000;
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    ((vector<double,_std::allocator<double>_> *)&lower,(double *)&solveLp);
          solveLp.this = (Highs *)CONCAT44(solveLp.this._4_4_,
                                           (int)((ulong)((long)col_upper.
                                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)col_upper.
                                                                                                                
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2));
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)&col_lower,(int *)&solveLp);
          std::vector<double,_std::allocator<double>_>::push_back(&ecol_cost,&upper);
          evar_ix = evar_ix + 1;
        }
        if (upper_penalty != INFINITY) {
          std::vector<int,_std::allocator<int>_>::push_back(&row_of_ecol,&local_4b8);
          if (pbVar5 != pbVar4) {
            std::__cxx11::to_string(&local_398,local_4b8);
            std::operator+(&local_2b8,"row_",&local_398);
            std::operator+(&local_378,&local_2b8,"_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &iRow,&local_378,
                           (this->model_).lp_.row_names_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + local_4b8);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &solveLp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&iRow,"_upper");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &ecol_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&solveLp
                      );
            std::__cxx11::string::~string((string *)&solveLp);
            std::__cxx11::string::~string((string *)&iRow);
            std::__cxx11::string::~string((string *)&local_378);
            std::__cxx11::string::~string((string *)&local_2b8);
            std::__cxx11::string::~string((string *)&local_398);
          }
          std::vector<double,_std::allocator<double>_>::push_back
                    (&bound_of_row_of_ecol,&upper_penalty);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&col_upper,&local_4b8);
          solveLp.this = (Highs *)0xbff0000000000000;
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    ((vector<double,_std::allocator<double>_> *)&lower,(double *)&solveLp);
          solveLp.this = (Highs *)CONCAT44(solveLp.this._4_4_,
                                           (int)((ulong)((long)col_upper.
                                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)col_upper.
                                                                                                                
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2));
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)&col_lower,(int *)&solveLp);
          std::vector<double,_std::allocator<double>_>::push_back(&ecol_cost,&upper);
          evar_ix = evar_ix + 1;
        }
      }
    }
    uVar14 = (int)((ulong)((long)col_lower.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)col_lower.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2) - 1;
    __n = (size_type)(int)uVar14;
    HVar9 = *(HighsInt *)
             ((long)col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + __n * 4);
    solveLp.this = (Highs *)0x0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&ecol_lower,__n,(value_type_conflict1 *)&solveLp);
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&ecol_upper,__n,(value_type_conflict1 *)&kHighsInf);
    run_status = addCols(this,uVar14,
                         ecol_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         ecol_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         ecol_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,HVar9,
                         (HighsInt *)
                         col_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (HighsInt *)
                         col_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,(double *)lower);
    if (pbVar5 != pbVar4) {
      uVar12 = 0;
      uVar15 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar15 = uVar12;
      }
      iVar10 = (int)local_4a0;
      for (; uVar15 * 0x20 != uVar12; uVar12 = uVar12 + 0x20) {
        passColName(this,iVar10,
                    (string *)
                    ((long)&((ecol_name.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar12
                    ));
        iVar10 = iVar10 + 1;
      }
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&lower);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&col_upper);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&col_lower);
  }
  solveLp.run_status = &run_status;
  solveLp.this = this;
  return_status = elasticityFilter::anon_class_16_2_1ead1ca1::operator()(&solveLp);
  run_status = return_status;
  if (return_status == kOk) {
    if ((char)local_43c == '\0') {
      this_00 = &local_78;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)this_00,&original_col_upper);
      this_01 = &local_90;
      pdVar17 = (pointer)0x2543e7;
      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
                ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)this_01,
                 &original_integrality);
      return_status = kOk;
      original_col_upper_01.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)this_01;
      original_col_upper_01.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)this_00;
      original_col_upper_01.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pdVar17;
      original_integrality_01.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_start._4_2_ = uStack_4b4;
      original_integrality_01.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = local_4b8;
      original_integrality_01.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_start._6_1_ = local_4b2;
      original_integrality_01.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_start._7_1_ = local_4b1;
      original_integrality_01.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = run_status;
      original_integrality_01.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = uStack_4ac;
      original_integrality_01.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_4a8;
      original_integrality_01.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = evar_ix;
      elasticityFilterReturn
                (this,kOk,false,original_num_col,local_4a8,&original_col_cost,&original_col_lower,
                 original_col_upper_01,original_integrality_01);
    }
    else {
      iVar10 = (int)local_4a0;
      lVar7 = (long)(int)local_4a0;
      uVar15 = 0;
      do {
        uVar12 = uVar15;
        iVar13 = 0;
        if ((local_4b1 & 1) != 0) {
          iVar13 = 0;
          for (uVar15 = 0;
              uVar15 < (ulong)((long)col_of_ecol.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)col_of_ecol.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 2);
              uVar15 = uVar15 + 1) {
            dVar2 = (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)iVar3 + uVar15];
            pdVar1 = &(this->options_).super_HighsOptionsStruct.primal_feasibility_tolerance;
            if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
              changeColBounds(this,iVar3 + (int)uVar15,0.0,0.0);
              iVar13 = iVar13 + 1;
            }
          }
        }
        if (local_4b2 != 0) {
          for (uVar15 = 0;
              uVar15 < (ulong)((long)row_of_ecol.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)row_of_ecol.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 2);
              uVar15 = uVar15 + 1) {
            dVar2 = (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar7 + uVar15];
            pdVar1 = &(this->options_).super_HighsOptionsStruct.primal_feasibility_tolerance;
            if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
              changeColBounds(this,iVar10 + (int)uVar15,0.0,0.0);
              iVar13 = iVar13 + 1;
            }
          }
        }
        if (iVar13 == 0) break;
        return_status = elasticityFilter::anon_class_16_2_1ead1ca1::operator()(&solveLp);
        if (return_status != kOk) {
          this_00 = &local_a8;
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)this_00,&original_col_upper);
          this_01 = &local_c0;
          pdVar17 = (pointer)0x254553;
          std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
                    ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)this_01,
                     &original_integrality);
          original_col_upper_03.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)this_01;
          original_col_upper_03.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)this_00;
          original_col_upper_03.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = pdVar17;
          original_integrality_03.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_start._4_2_ = uStack_4b4;
          original_integrality_03.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ = local_4b8;
          original_integrality_03.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_start._6_1_ = local_4b2;
          original_integrality_03.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_start._7_1_ = local_4b1;
          original_integrality_03.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_finish._0_4_ = run_status;
          original_integrality_03.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_finish._4_4_ = uStack_4ac;
          original_integrality_03.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_4a8;
          original_integrality_03.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = evar_ix;
          elasticityFilterReturn
                    (this,return_status,false,original_num_col,local_4a8,&original_col_cost,
                     &original_col_lower,original_col_upper_03,original_integrality_03);
          goto LAB_00254589;
        }
        uVar15 = (ulong)((int)uVar12 + 1);
      } while (this->model_status_ != kInfeasible);
      piVar6 = (infeasible_row_subset->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((infeasible_row_subset->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish != piVar6) {
        (infeasible_row_subset->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = piVar6;
      }
      uVar14 = 0;
      if ((local_4b1 & 1) != 0) {
        uVar14 = 0;
        for (uVar15 = 0;
            uVar15 < (ulong)((long)col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                   .super__Vector_impl_data._M_finish -
                             (long)col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                   .super__Vector_impl_data._M_start >> 2); uVar15 = uVar15 + 1) {
          dVar2 = (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[(long)iVar3 + uVar15];
          if ((dVar2 == 0.0) && (!NAN(dVar2))) {
            uVar14 = uVar14 + 1;
            printf("Col e-col %2d (column %2d) corresponds to column %2d with bound %g and is enforced\n"
                   ,bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar15],uVar15 & 0xffffffff,
                   (ulong)(uint)(iVar3 + (int)uVar15),
                   (ulong)(uint)col_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar15]);
          }
        }
      }
      uVar11 = 0;
      if (local_4b2 != 0) {
        uVar11 = 0;
        for (uVar15 = 0;
            uVar15 < (ulong)((long)row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                   .super__Vector_impl_data._M_finish -
                             (long)row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                   .super__Vector_impl_data._M_start >> 2); uVar15 = uVar15 + 1) {
          iRow = row_of_ecol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar15];
          dVar2 = (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar7 + uVar15];
          if ((dVar2 == 0.0) && (!NAN(dVar2))) {
            std::vector<int,_std::allocator<int>_>::push_back(infeasible_row_subset,&iRow);
            uVar11 = uVar11 + 1;
          }
        }
      }
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                   "Elasticity filter after %d passes enforces bounds on %d cols and %d rows\n",
                   uVar12,(ulong)uVar14,(ulong)uVar11);
      this_00 = &local_d8;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)this_00,&original_col_upper);
      this_01 = &local_f0;
      pdVar17 = (pointer)0x2544e3;
      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
                ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)this_01,
                 &original_integrality);
      return_status = kOk;
      original_col_upper_02.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)this_01;
      original_col_upper_02.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)this_00;
      original_col_upper_02.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pdVar17;
      original_integrality_02.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_start._4_2_ = uStack_4b4;
      original_integrality_02.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = local_4b8;
      original_integrality_02.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_start._6_1_ = local_4b2;
      original_integrality_02.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_start._7_1_ = local_4b1;
      original_integrality_02.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = run_status;
      original_integrality_02.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = uStack_4ac;
      original_integrality_02.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_4a8;
      original_integrality_02.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = evar_ix;
      elasticityFilterReturn
                (this,kOk,iVar13 == 0,original_num_col,local_4a8,&original_col_cost,
                 &original_col_lower,original_col_upper_02,original_integrality_02);
    }
  }
  else {
    this_00 = &local_48;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)this_00,&original_col_upper);
    this_01 = &local_60;
    pdVar17 = (pointer)0x2541cf;
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
              ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)this_01,&original_integrality)
    ;
    original_col_upper_00.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)this_01;
    original_col_upper_00.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this_00;
    original_col_upper_00.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pdVar17;
    original_integrality_00.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start._4_2_ = uStack_4b4;
    original_integrality_00.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = local_4b8;
    original_integrality_00.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start._6_1_ = local_4b2;
    original_integrality_00.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start._7_1_ = local_4b1;
    original_integrality_00.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = run_status;
    original_integrality_00.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = uStack_4ac;
    original_integrality_00.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = local_4a8;
    original_integrality_00.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = evar_ix;
    elasticityFilterReturn
              (this,return_status,false,original_num_col,local_4a8,&original_col_cost,
               &original_col_lower,original_col_upper_00,original_integrality_00);
  }
LAB_00254589:
  std::_Vector_base<HighsVarType,_std::allocator<HighsVarType>_>::~_Vector_base(this_01);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(this_00);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&zero_costs.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<HighsVarType,_std::allocator<HighsVarType>_>::~_Vector_base
            (&original_integrality.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&original_col_upper.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&original_col_lower.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&original_col_cost.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ecol_upper.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ecol_lower.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ecol_cost.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&erow_name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&ecol_name);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&erow_value.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&erow_index.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&erow_start.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&erow_upper.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&erow_lower.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&bound_of_col_of_ecol.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&bound_of_row_of_ecol.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&row_of_ecol.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&col_of_ecol.super__Vector_base<int,_std::allocator<int>_>);
  return return_status;
}

Assistant:

HighsStatus Highs::elasticityFilter(
    const double global_lower_penalty, const double global_upper_penalty,
    const double global_rhs_penalty, const double* local_lower_penalty,
    const double* local_upper_penalty, const double* local_rhs_penalty,
    const bool get_infeasible_row,
    std::vector<HighsInt>& infeasible_row_subset) {
  //  this->writeModel("infeasible.mps");
  // Solve the feasibility relaxation problem for the given penalties,
  // continuing to act as the elasticity filter get_infeasible_row is
  // true, resulting in an infeasibility subset for further refinement
  // as an IIS
  //
  // Construct the e-LP:
  //
  // Constraints L <= Ax <= U; l <= x <= u
  //
  // Transformed to
  //
  // L <= Ax + e_L - e_U <= U,
  //
  // l <=  x + e_l - e_u <= u,
  //
  // where the elastic variables are not used if the corresponding
  // bound is infinite or the local/global penalty is negative.
  //
  // x is free, and the objective is the linear function of the
  // elastic variables given by the local/global penalties
  //
  // col_of_ecol lists the column indices corresponding to the entries in
  // bound_of_col_of_ecol so that the results can be interpreted
  //
  // row_of_ecol lists the row indices corresponding to the entries in
  // bound_of_row_of_ecol so that the results can be interpreted
  std::vector<HighsInt> col_of_ecol;
  std::vector<HighsInt> row_of_ecol;
  std::vector<double> bound_of_row_of_ecol;
  std::vector<double> bound_of_col_of_ecol;
  std::vector<double> erow_lower;
  std::vector<double> erow_upper;
  std::vector<HighsInt> erow_start;
  std::vector<HighsInt> erow_index;
  std::vector<double> erow_value;
  // Accumulate names for ecols and erows, re-using ecol_name for the
  // names of row ecols after defining the names of col ecols
  std::vector<std::string> ecol_name;
  std::vector<std::string> erow_name;
  std::vector<double> ecol_cost;
  std::vector<double> ecol_lower;
  std::vector<double> ecol_upper;
  const HighsLp& lp = this->model_.lp_;
  HighsInt evar_ix = lp.num_col_;
  HighsStatus run_status;
  const bool write_model = false;
  // Take copies of the original model dimensions and column data
  // vectors, as they will be modified in forming the e-LP
  const HighsInt original_num_col = lp.num_col_;
  const HighsInt original_num_row = lp.num_row_;
  const std::vector<double> original_col_cost = lp.col_cost_;
  const std::vector<double> original_col_lower = lp.col_lower_;
  const std::vector<double> original_col_upper = lp.col_upper_;
  const std::vector<HighsVarType> original_integrality = lp.integrality_;
  // Zero the column costs
  std::vector<double> zero_costs;
  zero_costs.assign(original_num_col, 0);
  run_status = this->changeColsCost(0, lp.num_col_ - 1, zero_costs.data());
  assert(run_status == HighsStatus::kOk);

  if (get_infeasible_row && lp.integrality_.size()) {
    // Set any integrality to continuous
    std::vector<HighsVarType> all_continuous;
    all_continuous.assign(original_num_col, HighsVarType::kContinuous);
    run_status =
        this->changeColsIntegrality(0, lp.num_col_ - 1, all_continuous.data());
    assert(run_status == HighsStatus::kOk);
  }

  // For the columns
  const bool has_local_lower_penalty = local_lower_penalty;
  const bool has_global_elastic_lower = global_lower_penalty >= 0;
  const bool has_elastic_lower =
      has_local_lower_penalty || has_global_elastic_lower;
  const bool has_local_upper_penalty = local_upper_penalty;
  const bool has_global_elastic_upper = global_upper_penalty >= 0;
  const bool has_elastic_upper =
      has_local_upper_penalty || has_global_elastic_upper;
  const bool has_elastic_columns = has_elastic_lower || has_elastic_upper;
  // For the rows
  const bool has_local_rhs_penalty = local_rhs_penalty;
  const bool has_global_elastic_rhs = global_rhs_penalty >= 0;
  const bool has_elastic_rows = has_local_rhs_penalty || has_global_elastic_rhs;
  assert(has_elastic_columns || has_elastic_rows);

  const HighsInt col_ecol_offset = lp.num_col_;
  if (has_elastic_columns) {
    // Accumulate bounds to be used for columns
    std::vector<double> col_lower;
    std::vector<double> col_upper;
    // When defining names, need to know the column number
    const bool has_col_names = lp.col_names_.size() > 0;
    erow_start.push_back(0);
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      const double lower = lp.col_lower_[iCol];
      const double upper = lp.col_upper_[iCol];
      // Original bounds used unless e-variable introduced
      col_lower.push_back(lower);
      col_upper.push_back(upper);
      // Free columns have no erow
      if (lower <= -kHighsInf && upper >= kHighsInf) continue;

      // Get the penalty for violating the lower bounds on this column
      const double lower_penalty = has_local_lower_penalty
                                       ? local_lower_penalty[iCol]
                                       : global_lower_penalty;
      // Negative lower penalty and infinite upper bound implies that the
      // bounds cannot be violated
      if (lower_penalty < 0 && upper >= kHighsInf) continue;

      // Get the penalty for violating the upper bounds on this column
      const double upper_penalty = has_local_upper_penalty
                                       ? local_upper_penalty[iCol]
                                       : global_upper_penalty;
      // Infinite upper bound and negative lower penalty implies that the
      // bounds cannot be violated
      if (lower <= -kHighsInf && upper_penalty < 0) continue;
      erow_lower.push_back(lower);
      erow_upper.push_back(upper);
      if (has_col_names)
        erow_name.push_back("row_" + std::to_string(iCol) + "_" +
                            lp.col_names_[iCol] + "_erow");
      // Define the entry for x[iCol]
      erow_index.push_back(iCol);
      erow_value.push_back(1);
      if (lower > -kHighsInf && lower_penalty >= 0) {
        // New e_l variable
        col_of_ecol.push_back(iCol);
        if (has_col_names)
          ecol_name.push_back("col_" + std::to_string(iCol) + "_" +
                              lp.col_names_[iCol] + "_lower");
        // Save the original lower bound on this column and free its
        // lower bound
        bound_of_col_of_ecol.push_back(lower);
        col_lower[iCol] = -kHighsInf;
        erow_index.push_back(evar_ix);
        erow_value.push_back(1);
        ecol_cost.push_back(lower_penalty);
        evar_ix++;
      }
      if (upper < kHighsInf && upper_penalty >= 0) {
        // New e_u variable
        col_of_ecol.push_back(iCol);
        if (has_col_names)
          ecol_name.push_back("col_" + std::to_string(iCol) + "_" +
                              lp.col_names_[iCol] + "_upper");
        // Save the original upper bound on this column and free its
        // upper bound
        bound_of_col_of_ecol.push_back(upper);
        col_upper[iCol] = kHighsInf;
        erow_index.push_back(evar_ix);
        erow_value.push_back(-1);
        ecol_cost.push_back(upper_penalty);
        evar_ix++;
      }
      erow_start.push_back(erow_index.size());
      HighsInt row_nz =
          erow_start[erow_start.size() - 1] - erow_start[erow_start.size() - 2];
      //      printf("eRow for column %d has %d nonzeros\n", int(iCol),
      //      int(row_nz));
      assert(row_nz == 2 || row_nz == 3);
    }
    HighsInt num_new_col = col_of_ecol.size();
    HighsInt num_new_row = erow_start.size() - 1;
    HighsInt num_new_nz = erow_start[num_new_row];
    if (kIisDevReport)
      printf(
          "Elasticity filter: For columns there are %d variables and %d "
          "constraints\n",
          int(num_new_col), int(num_new_row));
    // Apply the original column bound changes
    assert(col_lower.size() == static_cast<size_t>(lp.num_col_));
    assert(col_upper.size() == static_cast<size_t>(lp.num_col_));
    run_status = this->changeColsBounds(0, lp.num_col_ - 1, col_lower.data(),
                                        col_upper.data());
    assert(run_status == HighsStatus::kOk);
    // Add the new columns
    ecol_lower.assign(num_new_col, 0);
    ecol_upper.assign(num_new_col, kHighsInf);
    run_status = this->addCols(num_new_col, ecol_cost.data(), ecol_lower.data(),
                               ecol_upper.data(), 0, nullptr, nullptr, nullptr);
    assert(run_status == HighsStatus::kOk);
    // Add the new rows
    assert(erow_start.size() == static_cast<size_t>(num_new_row + 1));
    assert(erow_index.size() == static_cast<size_t>(num_new_nz));
    assert(erow_value.size() == static_cast<size_t>(num_new_nz));
    run_status = this->addRows(num_new_row, erow_lower.data(),
                               erow_upper.data(), num_new_nz, erow_start.data(),
                               erow_index.data(), erow_value.data());
    assert(run_status == HighsStatus::kOk);
    if (has_col_names) {
      for (HighsInt iCol = 0; iCol < num_new_col; iCol++)
        this->passColName(col_ecol_offset + iCol, ecol_name[iCol]);
      for (HighsInt iRow = 0; iRow < num_new_row; iRow++)
        this->passRowName(original_num_row + iRow, erow_name[iRow]);
    }
    assert(ecol_cost.size() == static_cast<size_t>(num_new_col));
    assert(ecol_lower.size() == static_cast<size_t>(num_new_col));
    assert(ecol_upper.size() == static_cast<size_t>(num_new_col));
    if (write_model) {
      printf("\nAfter adding %d e-rows\n=============\n", int(num_new_col));
      bool output_flag;
      run_status = this->getOptionValue("output_flag", output_flag);
      this->setOptionValue("output_flag", true);
      this->writeModel("");
      this->setOptionValue("output_flag", output_flag);
    }
  }
  const HighsInt row_ecol_offset = lp.num_col_;
  if (has_elastic_rows) {
    // Add the columns corresponding to the e_L and e_U variables for
    // the constraints
    ecol_name.clear();
    ecol_cost.clear();
    std::vector<HighsInt> ecol_start;
    std::vector<HighsInt> ecol_index;
    std::vector<double> ecol_value;
    ecol_start.push_back(0);
    const bool has_row_names = lp.row_names_.size() > 0;
    for (HighsInt iRow = 0; iRow < original_num_row; iRow++) {
      // Get the penalty for violating the bounds on this row
      const double penalty =
          has_local_rhs_penalty ? local_rhs_penalty[iRow] : global_rhs_penalty;
      // Negative penalty implies that the bounds cannot be violated
      if (penalty < 0) continue;
      const double lower = lp.row_lower_[iRow];
      const double upper = lp.row_upper_[iRow];
      if (lower > -kHighsInf) {
        // Create an e-var for the row lower bound
        row_of_ecol.push_back(iRow);
        if (has_row_names)
          ecol_name.push_back("row_" + std::to_string(iRow) + "_" +
                              lp.row_names_[iRow] + "_lower");
        bound_of_row_of_ecol.push_back(lower);
        // Define the sub-matrix column
        ecol_index.push_back(iRow);
        ecol_value.push_back(1);
        ecol_start.push_back(ecol_index.size());
        ecol_cost.push_back(penalty);
        evar_ix++;
      }
      if (upper < kHighsInf) {
        // Create an e-var for the row upper bound
        row_of_ecol.push_back(iRow);
        if (has_row_names)
          ecol_name.push_back("row_" + std::to_string(iRow) + "_" +
                              lp.row_names_[iRow] + "_upper");
        bound_of_row_of_ecol.push_back(upper);
        // Define the sub-matrix column
        ecol_index.push_back(iRow);
        ecol_value.push_back(-1);
        ecol_start.push_back(ecol_index.size());
        ecol_cost.push_back(penalty);
        evar_ix++;
      }
    }
    HighsInt num_new_col = ecol_start.size() - 1;
    HighsInt num_new_nz = ecol_start[num_new_col];
    ecol_lower.assign(num_new_col, 0);
    ecol_upper.assign(num_new_col, kHighsInf);
    assert(ecol_cost.size() == static_cast<size_t>(num_new_col));
    assert(ecol_lower.size() == static_cast<size_t>(num_new_col));
    assert(ecol_upper.size() == static_cast<size_t>(num_new_col));
    assert(ecol_start.size() == static_cast<size_t>(num_new_col + 1));
    assert(ecol_index.size() == static_cast<size_t>(num_new_nz));
    assert(ecol_value.size() == static_cast<size_t>(num_new_nz));
    run_status = this->addCols(num_new_col, ecol_cost.data(), ecol_lower.data(),
                               ecol_upper.data(), num_new_nz, ecol_start.data(),
                               ecol_index.data(), ecol_value.data());
    assert(run_status == HighsStatus::kOk);
    if (has_row_names) {
      for (HighsInt iCol = 0; iCol < num_new_col; iCol++)
        this->passColName(row_ecol_offset + iCol, ecol_name[iCol]);
    }

    if (write_model) {
      bool output_flag;
      printf("\nAfter adding %d e-cols\n=============\n", int(num_new_col));
      run_status = this->getOptionValue("output_flag", output_flag);
      this->setOptionValue("output_flag", true);
      this->writeModel("");
      this->setOptionValue("output_flag", output_flag);
    }
  }

  if (write_model) this->writeModel("elastic.mps");

  // Lambda for gathering data when solving an LP
  auto solveLp = [&]() -> HighsStatus {
    HighsIisInfo iis_info;
    iis_info.simplex_time = -this->getRunTime();
    iis_info.simplex_iterations = -info_.simplex_iteration_count;
    run_status = this->run();
    assert(run_status == HighsStatus::kOk);
    if (run_status != HighsStatus::kOk) return run_status;
    iis_info.simplex_time += this->getRunTime();
    iis_info.simplex_iterations += info_.simplex_iteration_count;
    this->iis_.info_.push_back(iis_info);
    return run_status;
  };

  run_status = solveLp();

  if (run_status != HighsStatus::kOk)
    return elasticityFilterReturn(run_status, false, original_num_col,
                                  original_num_row, original_col_cost,
                                  original_col_lower, original_col_upper,
                                  original_integrality);
  if (kIisDevReport) this->writeSolution("", kSolutionStylePretty);
  // Model status should be optimal, unless model is unbounded
  assert(this->model_status_ == HighsModelStatus::kOptimal ||
         this->model_status_ == HighsModelStatus::kUnbounded);

  if (!get_infeasible_row)
    return elasticityFilterReturn(HighsStatus::kOk, false, original_num_col,
                                  original_num_row, original_col_cost,
                                  original_col_lower, original_col_upper,
                                  original_integrality);
  const HighsSolution& solution = this->getSolution();
  // Now fix e-variables that are positive and re-solve until e-LP is infeasible
  HighsInt loop_k = 0;
  bool feasible_model = false;
  for (;;) {
    if (kIisDevReport)
      printf("\nElasticity filter pass %d\n==============\n", int(loop_k));
    HighsInt num_fixed = 0;
    if (has_elastic_columns) {
      for (size_t eCol = 0; eCol < col_of_ecol.size(); eCol++) {
        HighsInt iCol = col_of_ecol[eCol];
        if (solution.col_value[col_ecol_offset + eCol] >
            this->options_.primal_feasibility_tolerance) {
          if (kIisDevReport)
            printf(
                "E-col %2d (column %2d) corresponds to column %2d with bound "
                "%g "
                "and has solution value %g\n",
                int(eCol), int(col_ecol_offset + eCol), int(iCol),
                bound_of_col_of_ecol[eCol],
                solution.col_value[col_ecol_offset + eCol]);
          this->changeColBounds(col_ecol_offset + eCol, 0, 0);
          num_fixed++;
        }
      }
    }
    if (has_elastic_rows) {
      for (size_t eCol = 0; eCol < row_of_ecol.size(); eCol++) {
        HighsInt iRow = row_of_ecol[eCol];
        if (solution.col_value[row_ecol_offset + eCol] >
            this->options_.primal_feasibility_tolerance) {
          if (kIisDevReport)
            printf(
                "E-row %2d (column %2d) corresponds to    row %2d with bound "
                "%g "
                "and has solution value %g\n",
                int(eCol), int(row_ecol_offset + eCol), int(iRow),
                bound_of_row_of_ecol[eCol],
                solution.col_value[row_ecol_offset + eCol]);
          this->changeColBounds(row_ecol_offset + eCol, 0, 0);
          num_fixed++;
        }
      }
    }
    if (num_fixed == 0) {
      // No elastic variables were positive, so problem is feasible
      feasible_model = true;
      break;
    }
    HighsStatus run_status = solveLp();
    if (run_status != HighsStatus::kOk)
      return elasticityFilterReturn(run_status, feasible_model,
                                    original_num_col, original_num_row,
                                    original_col_cost, original_col_lower,
                                    original_col_upper, original_integrality);
    if (kIisDevReport) this->writeSolution("", kSolutionStylePretty);
    HighsModelStatus model_status = this->getModelStatus();
    if (model_status == HighsModelStatus::kInfeasible) break;
    loop_k++;
  }

  infeasible_row_subset.clear();
  HighsInt num_enforced_col_ecol = 0;
  HighsInt num_enforced_row_ecol = 0;
  if (has_elastic_columns) {
    for (size_t eCol = 0; eCol < col_of_ecol.size(); eCol++) {
      HighsInt iCol = col_of_ecol[eCol];
      if (lp.col_upper_[col_ecol_offset + eCol] == 0) {
        num_enforced_col_ecol++;
        printf(
            "Col e-col %2d (column %2d) corresponds to column %2d with bound "
            "%g "
            "and is enforced\n",
            int(eCol), int(col_ecol_offset + eCol), int(iCol),
            bound_of_col_of_ecol[eCol]);
      }
    }
  }
  if (has_elastic_rows) {
    for (size_t eCol = 0; eCol < row_of_ecol.size(); eCol++) {
      HighsInt iRow = row_of_ecol[eCol];
      if (lp.col_upper_[row_ecol_offset + eCol] == 0) {
        num_enforced_row_ecol++;
        infeasible_row_subset.push_back(iRow);
        if (kIisDevReport)
          printf(
              "Row e-col %2d (column %2d) corresponds to    row %2d with bound "
              "%g and is enforced\n",
              int(eCol), int(row_ecol_offset + eCol), int(iRow),
              bound_of_row_of_ecol[eCol]);
      }
    }
  }
  if (feasible_model)
    assert(num_enforced_col_ecol == 0 && num_enforced_row_ecol == 0);

  highsLogUser(
      options_.log_options, HighsLogType::kInfo,
      "Elasticity filter after %d passes enforces bounds on %d cols and %d "
      "rows\n",
      int(loop_k), int(num_enforced_col_ecol), int(num_enforced_row_ecol));

  if (kIisDevReport)
    printf(
        "\nElasticity filter after %d passes enforces bounds on %d cols and %d "
        "rows\n",
        int(loop_k), int(num_enforced_col_ecol), int(num_enforced_row_ecol));

  return elasticityFilterReturn(HighsStatus::kOk, feasible_model,
                                original_num_col, original_num_row,
                                original_col_cost, original_col_lower,
                                original_col_upper, original_integrality);
}